

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

bitset_container_t * bitset_container_clone(bitset_container_t *src)

{
  uint uVar1;
  uint64_t *puVar2;
  int32_t *in_RDI;
  size_t align_size;
  bitset_container_t *bitset;
  size_t in_stack_ffffffffffffffd8;
  size_t alignment;
  bitset_container_t *local_8;
  
  local_8 = (bitset_container_t *)roaring_malloc(0x1146d3);
  if (local_8 == (bitset_container_t *)0x0) {
    local_8 = (bitset_container_t *)0x0;
  }
  else {
    uVar1 = croaring_hardware_support();
    if ((uVar1 & 2) == 0) {
      alignment = 0x20;
    }
    else {
      alignment = 0x40;
    }
    puVar2 = (uint64_t *)roaring_aligned_malloc(alignment,in_stack_ffffffffffffffd8);
    local_8->words = puVar2;
    if (local_8->words == (uint64_t *)0x0) {
      roaring_free((void *)0x114749);
      local_8 = (bitset_container_t *)0x0;
    }
    else {
      local_8->cardinality = *in_RDI;
      memcpy(local_8->words,*(void **)(in_RDI + 2),0x2000);
    }
  }
  return local_8;
}

Assistant:

ALLOW_UNALIGNED
bitset_container_t *bitset_container_clone(const bitset_container_t *src) {
    bitset_container_t *bitset =
        (bitset_container_t *)roaring_malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }

    size_t align_size = 32;
#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        // sizeof(__m512i) == 64
        align_size = 64;
    } else {
        // sizeof(__m256i) == 32
        align_size = 32;
    }
#endif
    bitset->words = (uint64_t *)roaring_aligned_malloc(
        align_size, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        roaring_free(bitset);
        return NULL;
    }
    bitset->cardinality = src->cardinality;
    memcpy(bitset->words, src->words,
           sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    return bitset;
}